

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_atomics.cpp
# Opt level: O0

bool anon_unknown.dwarf_1db422::HasOnlyFloatReturnType(Op opcode)

{
  bool local_9;
  Op opcode_local;
  
  if ((opcode - OpAtomicFMinEXT < 2) || (opcode == OpAtomicFAddEXT)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool HasOnlyFloatReturnType(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpAtomicFAddEXT:
    case spv::Op::OpAtomicFMinEXT:
    case spv::Op::OpAtomicFMaxEXT:
      return true;
      break;
    default:
      return false;
  }
}